

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FZFile.cpp
# Opt level: O3

void __thiscall FZFile::gen_outline(FZFile *this)

{
  pointer pBVar1;
  pointer pBVar2;
  pointer pBVar3;
  vector<BRDPoint,_std::allocator<BRDPoint>_> *this_00;
  int iVar4;
  int iVar5;
  pointer pBVar6;
  pointer pBVar7;
  pointer pBVar8;
  int iVar9;
  int iVar10;
  BRDPoint local_38;
  
  pBVar2 = (this->super_BRDFileBase).pins.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pBVar1 = (this->super_BRDFileBase).pins.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pBVar3 = pBVar2 + 1;
  iVar4 = (pBVar2->pos).x;
  pBVar6 = pBVar2;
  pBVar7 = pBVar3;
  iVar5 = iVar4;
  if (pBVar3 == pBVar1 || pBVar2 == pBVar1) {
    iVar9 = (pBVar2->pos).y;
  }
  else {
    do {
      iVar9 = (pBVar7->pos).x;
      if (iVar9 < iVar5) {
        pBVar6 = pBVar7;
        iVar5 = iVar9;
      }
      pBVar7 = pBVar7 + 1;
    } while (pBVar7 != pBVar1);
    iVar5 = (pBVar6->pos).x;
    pBVar6 = pBVar2;
    pBVar7 = pBVar3;
    do {
      iVar9 = (pBVar7->pos).x;
      iVar10 = iVar4;
      if (iVar4 <= iVar9) {
        iVar10 = iVar9;
      }
      if (iVar4 < iVar9) {
        pBVar6 = pBVar7;
      }
      pBVar7 = pBVar7 + 1;
      iVar4 = iVar10;
    } while (pBVar7 != pBVar1);
    iVar4 = (pBVar6->pos).x;
    pBVar6 = pBVar3;
    pBVar7 = pBVar2;
    do {
      pBVar8 = pBVar6;
      if ((pBVar7->pos).y <= (pBVar6->pos).y) {
        pBVar8 = pBVar7;
      }
      pBVar6 = pBVar6 + 1;
      pBVar7 = pBVar8;
    } while (pBVar6 != pBVar1);
    iVar9 = (pBVar8->pos).y;
    do {
      pBVar6 = pBVar3;
      if ((pBVar3->pos).y <= (pBVar2->pos).y) {
        pBVar6 = pBVar2;
      }
      pBVar2 = pBVar6;
      pBVar3 = pBVar3 + 1;
    } while (pBVar3 != pBVar1);
  }
  iVar5 = iVar5 + -0x14;
  iVar9 = iVar9 + -0x14;
  iVar10 = (pBVar2->pos).y + 0x14;
  this_00 = &(this->super_BRDFileBase).format;
  local_38.y = iVar9;
  local_38.x = iVar5;
  std::vector<BRDPoint,_std::allocator<BRDPoint>_>::emplace_back<BRDPoint>(this_00,&local_38);
  local_38.x = iVar4 + 0x14;
  std::vector<BRDPoint,_std::allocator<BRDPoint>_>::emplace_back<BRDPoint>(this_00,&local_38);
  local_38.y = iVar10;
  std::vector<BRDPoint,_std::allocator<BRDPoint>_>::emplace_back<BRDPoint>(this_00,&local_38);
  local_38.x = iVar5;
  std::vector<BRDPoint,_std::allocator<BRDPoint>_>::emplace_back<BRDPoint>(this_00,&local_38);
  local_38.y = iVar9;
  std::vector<BRDPoint,_std::allocator<BRDPoint>_>::emplace_back<BRDPoint>(this_00,&local_38);
  return;
}

Assistant:

void FZFile::gen_outline() {
	// Determine board outline
	int minx =
	    std::min_element(pins.begin(), pins.end(), [](BRDPin a, BRDPin b) { return a.pos.x < b.pos.x; })->pos.x - OUTLINE_MARGIN;
	int maxx =
	    std::max_element(pins.begin(), pins.end(), [](BRDPin a, BRDPin b) { return a.pos.x < b.pos.x; })->pos.x + OUTLINE_MARGIN;
	int miny =
	    std::min_element(pins.begin(), pins.end(), [](BRDPin a, BRDPin b) { return a.pos.y < b.pos.y; })->pos.y - OUTLINE_MARGIN;
	int maxy =
	    std::max_element(pins.begin(), pins.end(), [](BRDPin a, BRDPin b) { return a.pos.y < b.pos.y; })->pos.y + OUTLINE_MARGIN;
	format.push_back({minx, miny});
	format.push_back({maxx, miny});
	format.push_back({maxx, maxy});
	format.push_back({minx, maxy});
	format.push_back({minx, miny});
}